

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomialfit.cpp
# Opt level: O2

fraction * __thiscall
PolynomialFit::calcMatrixUnit(fraction *__return_storage_ptr__,PolynomialFit *this,int x,int y)

{
  int iVar1;
  long lVar2;
  int i;
  long lVar3;
  
  iVar1 = *(int *)((long)__return_storage_ptr__ + 0x14);
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < *(int *)((long)__return_storage_ptr__ + 0x38); lVar3 = lVar3 + 1) {
    pow((double)*(longdouble *)(*(long *)(__return_storage_ptr__ + 2) + lVar2),
        (double)(iVar1 * 2 - ((int)this + x)));
    lVar2 = lVar2 + 0x10;
  }
  return (fraction *)(long)*(int *)((long)__return_storage_ptr__ + 0x38);
}

Assistant:

fraction PolynomialFit::calcMatrixUnit(int x, int y)
{
    fraction sum = 0.0;
    double n = 2*degree - x - y  ;
    for(int i=0;i<count;i++)
    {
        sum += pow( (double)sx[i] , n ) * weight[i];
    }

    return sum;
}